

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Entry * __thiscall
kj::Vector<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>::
add<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>
          (Vector<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry> *this,Entry *params)

{
  Entry *pEVar1;
  long lVar2;
  undefined8 *puVar3;
  byte bVar4;
  
  bVar4 = 0;
  puVar3 = *(undefined8 **)(this + 8);
  if (puVar3 == *(undefined8 **)(this + 0x10)) {
    Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry>::grow
              ((Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)this,0);
    puVar3 = *(undefined8 **)(this + 8);
  }
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar3 = (params->key).content.ptr;
    params = (Entry *)((long)params + (ulong)bVar4 * -0x10 + 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  pEVar1 = *(Entry **)(this + 8);
  *(Entry **)(this + 8) = pEVar1 + 1;
  return pEVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }